

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureExtensionError_Test::
TestBody(CommandLineInterfaceTest_FeatureExtensionError_Test *this)

{
  MockCodeGenerator *this_00;
  initializer_list<const_google::protobuf::FieldDescriptor_*> __l;
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  string_view local_130;
  allocator<char> local_119;
  string local_118;
  allocator<const_google::protobuf::FieldDescriptor_*> local_f1;
  FieldDescriptor *local_f0;
  iterator local_e8;
  size_type local_e0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  string_view local_c0;
  string_view local_b0;
  string local_a0;
  string_view local_80;
  string_view local_70 [2];
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_FeatureExtensionError_Test *local_10;
  CommandLineInterfaceTest_FeatureExtensionError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  pDVar1 = DescriptorProto::descriptor();
  pFVar2 = Descriptor::file(pDVar1);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,pFVar2);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_70,"features.proto");
  pDVar1 = pb::TestInvalidFeatures::descriptor();
  pFVar2 = Descriptor::file(pDVar1);
  FileDescriptor::DebugString_abi_cxx11_(&local_a0,pFVar2);
  local_80 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,local_70[0],local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c0,
             "\n    edition = \"2023\";\n    import \"features.proto\";\n    message Foo {\n      int32 bar = 1;\n      int32 baz = 2 [features.(pb.test_invalid).repeated_feature = 5];\n    }"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_b0,local_c0);
  this_00 = (this->super_CommandLineInterfaceTest).mock_generator_;
  local_f0 = GetExtensionReflection<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestInvalidFeatures>,(unsigned_char)11,false,google::protobuf::DescriptorPool>
                       ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestInvalidFeatures>,_(unsigned_char)__v_,_false>
                         *)pb::test_invalid);
  local_e8 = &local_f0;
  local_e0 = 1;
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(&local_f1);
  __l._M_len = local_e0;
  __l._M_array = local_e8;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&local_d8,__l,&local_f1);
  MockCodeGenerator::set_feature_extensions(this_00,&local_d8);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector(&local_d8);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto",&local_119);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130,
             "Feature field pb.TestInvalidFeatures.repeated_feature is an unsupported repeated field"
            );
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_130);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureExtensionError) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 pb::TestInvalidFeatures::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "features.proto";
    message Foo {
      int32 bar = 1;
      int32 baz = 2 [features.(pb.test_invalid).repeated_feature = 5];
    })schema");

  mock_generator_->set_feature_extensions(
      {GetExtensionReflection(pb::test_invalid)});

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Feature field pb.TestInvalidFeatures.repeated_feature is an unsupported "
      "repeated field");
}